

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O2

size_t ZSTD_compressBlock_fast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  BYTE *pInLimit;
  BYTE *pBVar1;
  long *plVar2;
  undefined8 *puVar3;
  uint uVar4;
  BYTE *pBVar5;
  U32 *pUVar6;
  BYTE *pBVar7;
  undefined8 uVar8;
  char cVar9;
  uint uVar10;
  uint uVar11;
  long *plVar12;
  BYTE *pBVar13;
  size_t sVar14;
  seqDef *psVar15;
  long *plVar16;
  byte bVar17;
  byte bVar18;
  uint uVar19;
  BYTE *pBVar20;
  BYTE *pBVar21;
  U32 UVar22;
  U32 UVar23;
  BYTE *litEnd;
  long *plVar24;
  ulong uVar25;
  long lVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  long lVar32;
  int iVar33;
  uint uVar34;
  long lVar35;
  int *piVar36;
  ulong uVar37;
  int iVar38;
  ulong uVar39;
  ulong uVar40;
  uint uVar41;
  long *plVar42;
  uint local_a8;
  BYTE *litLimit_w_1;
  BYTE *litLimit_w;
  long lVar31;
  
  uVar34 = (ms->cParams).targetLength;
  uVar34 = uVar34 + (uVar34 == 0);
  pBVar5 = (ms->window).base;
  pInLimit = (BYTE *)((long)src + srcSize);
  uVar29 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar33 = (int)pBVar5;
  iVar38 = (int)pInLimit - iVar33;
  uVar10 = (ms->window).lowLimit;
  uVar41 = uVar10;
  if (uVar29 < iVar38 - uVar10) {
    uVar41 = iVar38 - uVar29;
  }
  UVar23 = ms->loadedDictEnd;
  if (UVar23 != 0) {
    uVar41 = uVar10;
  }
  plVar2 = (long *)((long)src + (srcSize - 8));
  pUVar6 = ms->hashTable;
  uVar10 = (ms->window).dictLimit;
  uVar28 = *rep;
  local_a8 = rep[1];
  uVar40 = (ulong)uVar41;
  if (uVar41 < uVar10) {
    uVar40 = (ulong)uVar10;
  }
  cVar9 = (char)(ms->cParams).hashLog;
  if (uVar10 <= uVar41) {
    uVar41 = iVar38 - uVar29;
    if (iVar38 - uVar10 <= uVar29) {
      uVar41 = uVar10;
    }
    if (UVar23 != 0) {
      uVar41 = uVar10;
    }
    plVar24 = (long *)((ulong)(pBVar5 + uVar41 == (BYTE *)src) + (long)src);
    iVar38 = (int)plVar24 - iVar33;
    uVar19 = iVar38 - uVar29;
    if (iVar38 - uVar10 <= uVar29) {
      uVar19 = uVar10;
    }
    if (UVar23 != 0) {
      uVar19 = uVar10;
    }
    uVar19 = iVar38 - uVar19;
    uVar10 = local_a8;
    if (uVar19 < local_a8) {
      uVar10 = 0;
    }
    uVar40 = (ulong)uVar10;
    uVar10 = uVar28;
    if (uVar19 < uVar28) {
      uVar10 = 0;
    }
    bVar18 = 0x40 - cVar9;
    bVar17 = 0x20 - cVar9;
    plVar12 = (long *)(pInLimit + -0x20);
LAB_00583762:
    plVar16 = (long *)((long)plVar24 + 1);
    lVar35 = -(ulong)uVar10;
    do {
      uVar29 = (uint)uVar40;
      if (plVar2 <= plVar16) {
        uVar34 = 0;
        if (uVar19 < local_a8) {
          uVar34 = local_a8;
        }
        if (uVar19 < uVar28) {
          uVar34 = uVar28;
        }
        if (uVar10 == 0) {
          uVar10 = uVar34;
        }
        *rep = uVar10;
        if (uVar29 != 0) {
          uVar34 = uVar29;
        }
        goto LAB_00583d51;
      }
      iVar38 = mls - 5;
      switch(iVar38) {
      case 0:
        lVar26 = *plVar24;
        lVar32 = -0x30e4432345000000;
        break;
      case 1:
        lVar26 = *plVar24;
        lVar32 = -0x30e4432340650000;
        break;
      case 2:
        lVar26 = *plVar24;
        lVar32 = -0x30e44323405a9d00;
        break;
      case 3:
        lVar26 = *plVar24;
        uVar37 = (ulong)(lVar26 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f);
        lVar31 = *plVar16;
        uVar39 = lVar31 * -0x30e44323485a9b9d;
        goto LAB_0058381e;
      default:
        iVar27 = (int)*plVar24;
        uVar37 = (ulong)((uint)(iVar27 * -0x61c8864f) >> (bVar17 & 0x1f));
        iVar30 = (int)*plVar16;
        uVar39 = (ulong)((uint)(iVar30 * -0x61c8864f) >> (bVar17 & 0x1f));
        goto LAB_00583821;
      }
      uVar37 = (ulong)(lVar26 * lVar32) >> (bVar18 & 0x3f);
      lVar31 = *plVar16;
      uVar39 = lVar32 * lVar31;
LAB_0058381e:
      iVar30 = (int)lVar31;
      iVar27 = (int)lVar26;
      uVar39 = uVar39 >> (bVar18 & 0x3f);
LAB_00583821:
      uVar25 = (long)plVar24 - (long)pBVar5;
      uVar11 = pUVar6[uVar37];
      uVar4 = pUVar6[uVar39];
      UVar23 = (U32)uVar25;
      pUVar6[uVar37] = UVar23;
      pUVar6[uVar39] = (int)plVar16 - iVar33;
      if ((uVar10 != 0) && (*(int *)((long)plVar24 + lVar35 + 2) == *(int *)((long)plVar24 + 2))) {
        uVar40 = (ulong)(*(BYTE *)((long)plVar24 + 1) == *(BYTE *)((long)plVar24 + lVar35 + 1));
        plVar42 = (long *)((long)plVar24 + (2 - uVar40));
        piVar36 = (int *)(lVar35 + (long)plVar42);
        uVar40 = uVar40 | 4;
        UVar22 = 1;
        goto LAB_00583941;
      }
      if (((uVar41 < uVar11) &&
          (piVar36 = (int *)(pBVar5 + uVar11), plVar42 = plVar24, *piVar36 == iVar27)) ||
         ((uVar41 < uVar4 &&
          (piVar36 = (int *)(pBVar5 + uVar4), plVar42 = plVar16, *piVar36 == iVar30))))
      goto LAB_00583905;
      lVar26 = ((ulong)((long)plVar24 - (long)src) >> 7) + (ulong)(uVar34 + 1);
      plVar24 = (long *)((long)plVar24 + lVar26);
      plVar16 = (long *)((long)plVar16 + lVar26);
    } while( true );
  }
  pBVar7 = (ms->window).dictBase;
  pBVar1 = pBVar5 + uVar40;
  pBVar20 = pBVar7 + uVar40;
  bVar18 = 0x40 - cVar9;
  bVar17 = 0x20 - cVar9;
  uVar10 = (uint)uVar40;
  plVar12 = (long *)(pInLimit + -0x20);
  plVar24 = (long *)src;
LAB_00582f89:
  do {
    if (plVar2 <= plVar24) {
      *rep = uVar28;
      uVar34 = local_a8;
LAB_00583d51:
      rep[1] = uVar34;
      return (long)pInLimit - (long)src;
    }
    uVar40 = (ulong)(mls - 5);
    switch(uVar40) {
    case 0:
      lVar35 = -0x30e4432345000000;
      break;
    case 1:
      lVar35 = -0x30e4432340650000;
      break;
    case 2:
      lVar35 = -0x30e44323405a9d00;
      break;
    case 3:
      uVar37 = *plVar24 * -0x30e44323485a9b9d;
      goto LAB_00583008;
    default:
      uVar37 = (ulong)((uint)((int)*plVar24 * -0x61c8864f) >> (bVar17 & 0x1f));
      goto LAB_0058300e;
    }
    uVar37 = lVar35 * *plVar24;
LAB_00583008:
    uVar37 = uVar37 >> (bVar18 & 0x3f);
LAB_0058300e:
    uVar29 = pUVar6[uVar37];
    pBVar21 = pBVar5;
    if (uVar29 < uVar10) {
      pBVar21 = pBVar7;
    }
    uVar39 = (long)plVar24 - (long)pBVar5;
    UVar23 = (U32)uVar39;
    pUVar6[uVar37] = UVar23;
    if ((uVar28 < (UVar23 + 1) - uVar41) &&
       (uVar19 = (UVar23 + 1) - uVar28, 2 < (uVar10 - 1) - uVar19)) {
      pBVar13 = pBVar5;
      if (uVar19 < uVar10) {
        pBVar13 = pBVar7;
      }
      if (*(int *)(pBVar13 + uVar19) != *(int *)((long)plVar24 + 1)) goto LAB_00583061;
      plVar16 = (long *)((long)plVar24 + 1);
      pBVar21 = pInLimit;
      if (uVar19 < uVar10) {
        pBVar21 = pBVar20;
      }
      sVar14 = ZSTD_count_2segments
                         ((BYTE *)((long)plVar24 + 5),pBVar13 + (ulong)uVar19 + 4,pInLimit,pBVar21,
                          pBVar1);
      uVar37 = (long)plVar16 - (long)src;
      plVar24 = (long *)seqStore->lit;
      if (plVar12 < plVar16) {
        ZSTD_safecopyLiterals((BYTE *)plVar24,(BYTE *)src,(BYTE *)plVar16,(BYTE *)plVar12);
LAB_00583116:
        seqStore->lit = seqStore->lit + uVar37;
        psVar15 = seqStore->sequences;
        if (0xffff < uVar37) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        lVar35 = *(long *)((long)src + 8);
        *plVar24 = *src;
        plVar24[1] = lVar35;
        pBVar21 = seqStore->lit;
        if (0x10 < uVar37) {
          lVar35 = *(long *)((long)src + 0x18);
          *(long *)(pBVar21 + 0x10) = *(long *)((long)src + 0x10);
          *(long *)(pBVar21 + 0x18) = lVar35;
          if (0x20 < (long)uVar37) {
            lVar35 = 0;
            do {
              puVar3 = (undefined8 *)((long)src + lVar35 + 0x20);
              uVar8 = puVar3[1];
              pBVar13 = pBVar21 + lVar35 + 0x20;
              *(undefined8 *)pBVar13 = *puVar3;
              *(undefined8 *)(pBVar13 + 8) = uVar8;
              puVar3 = (undefined8 *)((long)src + lVar35 + 0x30);
              uVar8 = puVar3[1];
              *(undefined8 *)(pBVar13 + 0x10) = *puVar3;
              *(undefined8 *)(pBVar13 + 0x18) = uVar8;
              lVar35 = lVar35 + 0x20;
            } while (pBVar13 + 0x20 < pBVar21 + uVar37);
          }
          goto LAB_00583116;
        }
        seqStore->lit = pBVar21 + uVar37;
        psVar15 = seqStore->sequences;
      }
      psVar15->litLength = (U16)uVar37;
      psVar15->offset = 1;
      if (0xffff < sVar14 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar15->matchLength = (U16)(sVar14 + 1);
      seqStore->sequences = psVar15 + 1;
      plVar24 = (long *)((long)plVar16 + sVar14 + 4);
LAB_00583445:
      src = plVar24;
      if (plVar24 <= plVar2) {
        UVar22 = UVar23 + 2;
        uVar39 = uVar39 & 0xffffffff;
        switch(uVar40) {
        case 0:
          lVar35 = -0x30e4432345000000;
          break;
        case 1:
          lVar35 = -0x30e4432340650000;
          break;
        case 2:
          lVar35 = -0x30e44323405a9d00;
          break;
        case 3:
          pUVar6[(ulong)(*(long *)(pBVar5 + uVar39 + 2) * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] =
               UVar22;
          uVar37 = *(long *)((long)plVar24 + -2) * -0x30e44323485a9b9d;
          goto LAB_005834fb;
        default:
          pUVar6[(uint)(*(int *)(pBVar5 + uVar39 + 2) * -0x61c8864f) >> (bVar17 & 0x1f)] = UVar22;
          uVar37 = (ulong)((uint)(*(int *)((long)plVar24 + -2) * -0x61c8864f) >> (bVar17 & 0x1f));
          goto LAB_005834fe;
        }
        pUVar6[(ulong)(*(long *)(pBVar5 + uVar39 + 2) * lVar35) >> (bVar18 & 0x3f)] = UVar22;
        uVar37 = lVar35 * *(long *)((long)plVar24 + -2);
LAB_005834fb:
        uVar37 = uVar37 >> (bVar18 & 0x3f);
LAB_005834fe:
        pUVar6[uVar37] = ((int)plVar24 + -2) - iVar33;
        uVar29 = local_a8;
        for (; local_a8 = uVar29, src = plVar24, plVar24 <= plVar2;
            plVar24 = (long *)((long)plVar24 + sVar14 + 4)) {
          UVar22 = (int)plVar24 - iVar33;
          uVar29 = UVar22 - local_a8;
          pBVar21 = pBVar5;
          if (uVar29 < uVar10) {
            pBVar21 = pBVar7;
          }
          if (((UVar23 - uVar41 <= local_a8) || ((uVar10 - 1) - uVar29 < 3)) ||
             (*(int *)(pBVar21 + uVar29) != (int)*plVar24)) break;
          pBVar13 = pInLimit;
          if (uVar29 < uVar10) {
            pBVar13 = pBVar20;
          }
          sVar14 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar24 + 4),(BYTE *)((long)(pBVar21 + uVar29) + 4),
                              pInLimit,pBVar13,pBVar1);
          piVar36 = (int *)seqStore->lit;
          if (plVar12 < plVar24) {
            ZSTD_safecopyLiterals((BYTE *)piVar36,(BYTE *)plVar24,(BYTE *)plVar24,(BYTE *)plVar12);
          }
          else {
            iVar38 = *(int *)((long)plVar24 + 4);
            lVar35 = plVar24[1];
            iVar27 = *(int *)((long)plVar24 + 0xc);
            *piVar36 = (int)*plVar24;
            piVar36[1] = iVar38;
            piVar36[2] = (int)lVar35;
            piVar36[3] = iVar27;
          }
          psVar15 = seqStore->sequences;
          psVar15->litLength = 0;
          psVar15->offset = 1;
          if (0xffff < sVar14 + 1) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar15->matchLength = (U16)(sVar14 + 1);
          seqStore->sequences = psVar15 + 1;
          if (mls - 5 < 4) {
            sVar14 = (*(code *)(&DAT_0069715c + *(int *)(&DAT_0069715c + uVar40 * 4)))();
            return sVar14;
          }
          pUVar6[(uint)((int)*plVar24 * -0x61c8864f) >> (bVar17 & 0x1f)] = UVar22;
          uVar29 = uVar28;
          uVar28 = local_a8;
        }
      }
      goto LAB_00582f89;
    }
LAB_00583061:
    if ((uVar41 <= uVar29) && (piVar36 = (int *)(pBVar21 + uVar29), *piVar36 == (int)*plVar24)) {
      pBVar13 = pBVar1;
      pBVar21 = pInLimit;
      if (uVar29 < uVar10) {
        pBVar13 = pBVar7 + uVar41;
        pBVar21 = pBVar20;
      }
      sVar14 = ZSTD_count_2segments
                         ((BYTE *)((long)plVar24 + 4),(BYTE *)(piVar36 + 1),pInLimit,pBVar21,pBVar1)
      ;
      for (lVar35 = 0;
          ((plVar16 = (long *)((long)plVar24 + lVar35), pBVar13 < (BYTE *)(lVar35 + (long)piVar36)
           && (src < plVar16)) &&
          (*(BYTE *)((long)plVar24 + lVar35 + -1) == *(BYTE *)((long)piVar36 + lVar35 + -1)));
          lVar35 = lVar35 + -1) {
      }
      uVar37 = (long)plVar16 - (long)src;
      plVar42 = (long *)seqStore->lit;
      if (plVar12 < plVar16) {
        ZSTD_safecopyLiterals((BYTE *)plVar42,(BYTE *)src,(BYTE *)plVar16,(BYTE *)plVar12);
LAB_00583203:
        seqStore->lit = seqStore->lit + (long)((long)plVar24 + (lVar35 - (long)src));
        psVar15 = seqStore->sequences;
        if (0xffff < uVar37) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        lVar26 = *(long *)((long)src + 8);
        *plVar42 = *src;
        plVar42[1] = lVar26;
        pBVar21 = seqStore->lit;
        if (0x10 < uVar37) {
          lVar26 = *(long *)((long)src + 0x18);
          *(long *)(pBVar21 + 0x10) = *(long *)((long)src + 0x10);
          *(long *)(pBVar21 + 0x18) = lVar26;
          if (0x20 < (long)uVar37) {
            lVar26 = 0;
            do {
              puVar3 = (undefined8 *)((long)src + lVar26 + 0x20);
              uVar8 = puVar3[1];
              pBVar13 = pBVar21 + lVar26 + 0x20;
              *(undefined8 *)pBVar13 = *puVar3;
              *(undefined8 *)(pBVar13 + 8) = uVar8;
              puVar3 = (undefined8 *)((long)src + lVar26 + 0x30);
              uVar8 = puVar3[1];
              *(undefined8 *)(pBVar13 + 0x10) = *puVar3;
              *(undefined8 *)(pBVar13 + 0x18) = uVar8;
              lVar26 = lVar26 + 0x20;
            } while (pBVar13 + 0x20 < pBVar21 + (long)((long)plVar24 + (lVar35 - (long)src)));
          }
          goto LAB_00583203;
        }
        seqStore->lit = pBVar21 + (long)((long)plVar24 + (lVar35 - (long)src));
        psVar15 = seqStore->sequences;
      }
      psVar15->litLength = (short)lVar35 + ((short)plVar24 - (short)src);
      psVar15->offset = (UVar23 - uVar29) + 3;
      if (0xffff < (sVar14 - lVar35) + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar15->matchLength = ((short)sVar14 - (short)lVar35) + 1;
      seqStore->sequences = psVar15 + 1;
      plVar24 = (long *)((long)plVar16 + (sVar14 - lVar35) + 4);
      local_a8 = uVar28;
      uVar28 = UVar23 - uVar29;
      goto LAB_00583445;
    }
    plVar24 = (long *)((long)plVar24 + ((long)plVar24 - (long)src >> 8) + (ulong)uVar34);
  } while( true );
LAB_00583905:
  uVar11 = (int)plVar42 - (int)piVar36;
  uVar40 = 4;
  for (; ((pBVar5 + uVar41 < piVar36 && (src < plVar42)) &&
         (*(BYTE *)((long)plVar42 + -1) == *(BYTE *)((long)piVar36 + -1)));
      plVar42 = (long *)((long)plVar42 + -1)) {
    piVar36 = (int *)((long)piVar36 + -1);
    uVar40 = uVar40 + 1;
  }
  UVar22 = uVar11 + 3;
  uVar29 = uVar10;
  uVar10 = uVar11;
LAB_00583941:
  sVar14 = ZSTD_count((BYTE *)((long)plVar42 + uVar40),(BYTE *)((long)piVar36 + uVar40),pInLimit);
  uVar37 = (long)plVar42 - (long)src;
  plVar24 = (long *)seqStore->lit;
  if (plVar12 < plVar42) {
    ZSTD_safecopyLiterals((BYTE *)plVar24,(BYTE *)src,(BYTE *)plVar42,(BYTE *)plVar12);
LAB_00583994:
    seqStore->lit = seqStore->lit + uVar37;
    psVar15 = seqStore->sequences;
    if (0xffff < uVar37) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    lVar35 = *(long *)((long)src + 8);
    *plVar24 = *src;
    plVar24[1] = lVar35;
    pBVar1 = seqStore->lit;
    if (0x10 < uVar37) {
      lVar35 = *(long *)((long)src + 0x18);
      *(long *)(pBVar1 + 0x10) = *(long *)((long)src + 0x10);
      *(long *)(pBVar1 + 0x18) = lVar35;
      if (0x20 < (long)uVar37) {
        lVar35 = 0;
        do {
          puVar3 = (undefined8 *)((long)src + lVar35 + 0x20);
          uVar8 = puVar3[1];
          pBVar7 = pBVar1 + lVar35 + 0x20;
          *(undefined8 *)pBVar7 = *puVar3;
          *(undefined8 *)(pBVar7 + 8) = uVar8;
          puVar3 = (undefined8 *)((long)src + lVar35 + 0x30);
          uVar8 = puVar3[1];
          *(undefined8 *)(pBVar7 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar7 + 0x18) = uVar8;
          lVar35 = lVar35 + 0x20;
        } while (pBVar7 + 0x20 < pBVar1 + uVar37);
      }
      goto LAB_00583994;
    }
    seqStore->lit = pBVar1 + uVar37;
    psVar15 = seqStore->sequences;
  }
  uVar39 = (sVar14 + uVar40) - 3;
  psVar15->litLength = (U16)uVar37;
  psVar15->offset = UVar22;
  if (0xffff < uVar39) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
  }
  psVar15->matchLength = (U16)uVar39;
  seqStore->sequences = psVar15 + 1;
  src = (void *)((long)plVar42 + sVar14 + uVar40);
  uVar40 = (ulong)uVar29;
  plVar24 = (long *)src;
  if (plVar2 < src) goto LAB_00583762;
  UVar23 = UVar23 + 2;
  uVar25 = uVar25 & 0xffffffff;
  switch(iVar38) {
  case 0:
    lVar35 = -0x30e4432345000000;
    break;
  case 1:
    lVar35 = -0x30e4432340650000;
    break;
  case 2:
    lVar35 = -0x30e44323405a9d00;
    break;
  case 3:
    pUVar6[(ulong)(*(long *)(pBVar5 + uVar25 + 2) * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] =
         UVar23;
    uVar40 = *(long *)((long)src + -2) * -0x30e44323485a9b9d;
    goto LAB_00583b54;
  default:
    pUVar6[(uint)(*(int *)(pBVar5 + uVar25 + 2) * -0x61c8864f) >> (bVar17 & 0x1f)] = UVar23;
    uVar40 = (ulong)((uint)(*(int *)((long)src + -2) * -0x61c8864f) >> (bVar17 & 0x1f));
    goto LAB_00583b57;
  }
  pUVar6[(ulong)(*(long *)(pBVar5 + uVar25 + 2) * lVar35) >> (bVar18 & 0x3f)] = UVar23;
  uVar40 = lVar35 * *(long *)((long)src + -2);
LAB_00583b54:
  uVar40 = uVar40 >> (bVar18 & 0x3f);
LAB_00583b57:
  pUVar6[uVar40] = ((int)src + -2) - iVar33;
  uVar40 = 0;
  if (uVar29 != 0) {
    for (; uVar11 = uVar29, uVar40 = (ulong)uVar11, plVar24 = (long *)src, src <= plVar2;
        src = (void *)((long)src + sVar14 + 4)) {
      lVar35 = *src;
      if ((int)lVar35 != *(int *)((long)src - uVar40)) break;
      sVar14 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - uVar40)),pInLimit);
      switch(iVar38) {
      case 0:
        lVar35 = -0x30e4432345000000;
        break;
      case 1:
        lVar35 = -0x30e4432340650000;
        break;
      case 2:
        lVar35 = -0x30e44323405a9d00;
        break;
      case 3:
        uVar40 = *src * -0x30e44323485a9b9d;
        goto LAB_00583c1f;
      default:
        uVar40 = (ulong)((uint)((int)lVar35 * -0x61c8864f) >> (bVar17 & 0x1f));
        goto LAB_00583c2a;
      }
      uVar40 = lVar35 * *src;
LAB_00583c1f:
      uVar40 = uVar40 >> (bVar18 & 0x3f);
LAB_00583c2a:
      pUVar6[uVar40] = (int)src - iVar33;
      plVar24 = (long *)seqStore->lit;
      if (plVar12 < src) {
        ZSTD_safecopyLiterals((BYTE *)plVar24,(BYTE *)src,(BYTE *)src,(BYTE *)plVar12);
      }
      else {
        lVar35 = *(long *)((long)src + 8);
        *plVar24 = *src;
        plVar24[1] = lVar35;
      }
      psVar15 = seqStore->sequences;
      psVar15->litLength = 0;
      psVar15->offset = 1;
      if (0xffff < sVar14 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar15->matchLength = (U16)(sVar14 + 1);
      seqStore->sequences = psVar15 + 1;
      uVar29 = uVar10;
      uVar10 = uVar11;
    }
  }
  goto LAB_00583762;
}

Assistant:

static size_t ZSTD_compressBlock_fast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize, U32 const mls)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32 const hlog = cParams->hashLog;
    /* support stepSize of 0 */
    U32 const stepSize = cParams->targetLength + !(cParams->targetLength);
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = dictLimit < lowLimit ? lowLimit : dictLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_fast_extDict_generic (offset_1=%u)", offset_1);

    /* switch to "regular" variant if extDict is invalidated due to maxDistance */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, mls);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t h = ZSTD_hashPtr(ip, hlog, mls);
        const U32    matchIndex = hashTable[h];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE*  match = matchBase + matchIndex;
        const U32    curr = (U32)(ip-base);
        const U32    repIndex = curr + 1 - offset_1;
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        hashTable[h] = curr;   /* update hash table */
        DEBUGLOG(7, "offset_1 = %u , curr = %u", offset_1, curr);

        if ( ( ((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow */
             & (offset_1 < curr+1 - dictStartIndex) ) /* note: we are searching at curr+1 */
           && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* const repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            size_t const rLength = ZSTD_count_2segments(ip+1 +4, repMatch +4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, 0, rLength-MINMATCH);
            ip += rLength;
            anchor = ip;
        } else {
            if ( (matchIndex < dictStartIndex) ||
                 (MEM_read32(match) != MEM_read32(ip)) ) {
                assert(stepSize >= 1);
                ip += ((ip-anchor) >> kSearchStrength) + stepSize;
                continue;
            }
            {   const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 const offset = curr - matchIndex;
                size_t mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                offset_2 = offset_1; offset_1 = offset;  /* update offset history */
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);
                ip += mLength;
                anchor = ip;
        }   }

        if (ip <= ilimit) {
            /* Fill Table */
            hashTable[ZSTD_hashPtr(base+curr+2, hlog, mls)] = curr+2;
            hashTable[ZSTD_hashPtr(ip-2, hlog, mls)] = (U32)(ip-2-base);
            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* const repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3) & (offset_2 < curr - dictStartIndex))  /* intentional overflow */
                   && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    { U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset; }  /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0 /*litlen*/, anchor, iend, 0 /*offcode*/, repLength2-MINMATCH);
                    hashTable[ZSTD_hashPtr(ip, hlog, mls)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}